

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  char **ppcVar1;
  pointer pbVar2;
  pointer pcVar3;
  mapped_type_conflict1 mVar4;
  int iVar5;
  const_iterator cVar6;
  long *plVar7;
  cmValue cVar8;
  mapped_type_conflict1 *pmVar9;
  mapped_type *pmVar10;
  undefined8 *puVar11;
  string *psVar12;
  mapped_type_conflict *pmVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  pointer pbVar16;
  char *pcVar17;
  string *i;
  key_type *pkVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __str;
  int preference;
  string ignoreExtensionsVar;
  string ignoreExts;
  string outputExtensionVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string linkerPrefVar;
  mapped_type_conflict1 local_114;
  string local_110;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  char *local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char **local_70;
  long local_68;
  char *local_60 [2];
  pointer *local_50;
  long local_48;
  pointer local_40 [2];
  
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LanguageToLinkerPreference)._M_t,l);
  if ((_Rb_tree_header *)cVar6._M_node !=
      &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "CMAKE_",l);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_90._M_allocated_capacity = (size_type)&local_80;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar14) {
    local_80._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_80._8_8_ = plVar7[3];
  }
  else {
    local_80._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_90._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_90._8_8_ = plVar7[1];
  *plVar7 = (long)paVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  cVar8 = cmMakefile::GetDefinition(mf,(string *)&local_90);
  local_114 = 0;
  if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
    iVar5 = __isoc99_sscanf(((cVar8.Value)->_M_dataplus)._M_p,"%d",&local_114);
    if (iVar5 == 1) {
      if (local_114 < 0) {
        local_d0._0_8_ = local_90._8_8_;
        local_d0._8_8_ = local_90._M_allocated_capacity;
        local_d0._16_8_ = 0x1f;
        local_d0._24_8_ = " is negative, adjusting it to 0";
        views._M_len = 2;
        views._M_array = (iterator)local_d0;
        cmCatViews_abi_cxx11_(&local_110,views);
        cmSystemTools::Message(&local_110,"Warning");
        local_114 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_004136b8;
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    else if (*((cVar8.Value)->_M_dataplus)._M_p == 'P') {
      local_114 = 100;
    }
    else {
LAB_004136b8:
      local_114 = 0;
    }
  }
  mVar4 = local_114;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->LanguageToLinkerPreference,l);
  *pmVar9 = mVar4;
  std::operator+(&local_110,"CMAKE_",l);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_d0._0_8_ = local_d0 + 0x10;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar15) {
    local_d0._16_8_ = *psVar15;
    local_d0._24_8_ = plVar7[3];
  }
  else {
    local_d0._16_8_ = *psVar15;
    local_d0._0_8_ = (size_type *)*plVar7;
  }
  local_d0._8_8_ = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar14 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar14) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  cVar8 = cmMakefile::GetDefinition(mf,(string *)local_d0);
  if (cVar8.Value != (string *)0x0) {
    pcVar3 = ((cVar8.Value)->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + (cVar8.Value)->_M_string_length);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->LanguageToOutputExtension,l);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->OutputExtensions,&local_110);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    local_f0._M_len = local_110._M_string_length;
    local_f0._M_str = local_110._M_dataplus._M_p;
    __str._M_str = ".";
    __str._M_len = 1;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_f0,0,1,__str);
    if (iVar5 == 0) {
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_110);
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
      if ((char **)local_f0._M_len != &local_e0) {
        operator_delete((void *)local_f0._M_len,(ulong)(local_e0 + 1));
      }
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->OutputExtensions,&local_110);
      std::__cxx11::string::_M_assign((string *)pmVar10);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar14) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  FillExtensionToLanguageMap(this,l,mf);
  pkVar18 = (key_type *)(local_b0 + 0x10);
  local_b0._0_8_ = pkVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMAKE_","");
  pcVar3 = (l->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + l->_M_string_length)
  ;
  pbVar2 = (pointer)((long)&((_Alloc_hider *)local_b0._8_8_)->_M_p + local_48);
  pbVar16 = (pointer)0xf;
  if ((key_type *)local_b0._0_8_ != pkVar18) {
    pbVar16 = (pointer)local_b0._16_8_;
  }
  if (pbVar16 < pbVar2) {
    pbVar16 = (pointer)0xf;
    if (local_50 != local_40) {
      pbVar16 = local_40[0];
    }
    if (pbVar16 < pbVar2) goto LAB_004138fe;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_b0._0_8_);
  }
  else {
LAB_004138fe:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_b0,(ulong)local_50);
  }
  local_f0._M_len = (size_t)&local_e0;
  ppcVar1 = (char **)(puVar11 + 2);
  if ((char **)*puVar11 == ppcVar1) {
    local_e0 = *ppcVar1;
    uStack_d8 = *(undefined4 *)(puVar11 + 3);
    uStack_d4 = *(undefined4 *)((long)puVar11 + 0x1c);
  }
  else {
    local_e0 = *ppcVar1;
    local_f0._M_len = (size_t)*puVar11;
  }
  local_f0._M_str = (char *)puVar11[1];
  *puVar11 = ppcVar1;
  puVar11[1] = 0;
  *(undefined1 *)ppcVar1 = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_IGNORE_EXTENSIONS","");
  pcVar17 = (char *)0xf;
  if ((char **)local_f0._M_len != &local_e0) {
    pcVar17 = local_e0;
  }
  if (pcVar17 < local_f0._M_str + local_68) {
    pcVar17 = (char *)0xf;
    if (local_70 != local_60) {
      pcVar17 = local_60[0];
    }
    if (local_f0._M_str + local_68 <= pcVar17) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,local_f0._M_len);
      goto LAB_004139f2;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70);
LAB_004139f2:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_110.field_2._M_allocated_capacity = *psVar15;
    local_110.field_2._8_8_ = puVar11[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar15;
    local_110._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_110._M_string_length = puVar11[1];
  *puVar11 = psVar15;
  puVar11[1] = 0;
  *(undefined1 *)psVar15 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70,(ulong)(local_60[0] + 1));
  }
  if ((char **)local_f0._M_len != &local_e0) {
    operator_delete((void *)local_f0._M_len,(ulong)(local_e0 + 1));
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(ulong)((long)&(local_40[0]->_M_dataplus)._M_p + 1));
  }
  if ((key_type *)local_b0._0_8_ != pkVar18) {
    operator_delete((void *)local_b0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_b0._16_8_)->_M_p + 1));
  }
  psVar12 = cmMakefile::GetSafeDefinition(mf,&local_110);
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  local_f0._M_len = (size_t)&local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + psVar12->_M_string_length);
  arg._M_str = (char *)local_f0._M_len;
  arg._M_len = (size_t)local_f0._M_str;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,arg,false);
  if (local_b0._0_8_ != local_b0._8_8_) {
    pkVar18 = (key_type *)local_b0._0_8_;
    do {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::operator[](&this->IgnoreExtensions,pkVar18);
      *pmVar13 = true;
      pkVar18 = pkVar18 + 1;
    } while (pkVar18 != (key_type *)local_b0._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
  if ((char **)local_f0._M_len != &local_e0) {
    operator_delete((void *)local_f0._M_len,(ulong)(local_e0 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (cm::contains(this->LanguageToLinkerPreference, l)) {
    return;
  }

  std::string linkerPrefVar = "CMAKE_" + l + "_LINKER_PREFERENCE";
  cmValue linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (cmNonempty(linkerPref)) {
    if (sscanf(linkerPref->c_str(), "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if ((*linkerPref)[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg =
      cmStrCat(linkerPrefVar, " is negative, adjusting it to 0");
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = "CMAKE_" + l + "_OUTPUT_EXTENSION";
  if (cmValue p = mf->GetDefinition(outputExtensionVar)) {
    std::string outputExtension = *p;
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (cmHasPrefix(outputExtension, ".")) {
      outputExtension = outputExtension.substr(1);
      this->OutputExtensions[outputExtension] = outputExtension;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    std::string("CMAKE_") + std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList = cmExpandedList(ignoreExts);
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}